

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

int asm_snap_canremat(ASMState *as)

{
  Reg r;
  ASMState *as_local;
  
  r = 0x10;
  while( true ) {
    if (0x1f < r) {
      return 0;
    }
    if ((as->cost[r] & 0xffff) < 0x8000) break;
    r = r + 1;
  }
  return 1;
}

Assistant:

static int asm_snap_canremat(ASMState *as)
{
  Reg r;
  for (r = RID_MIN_FPR; r < RID_MAX_FPR; r++)
    if (irref_isk(regcost_ref(as->cost[r])))
      return 1;
  return 0;
}